

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger string_slice(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *pSVar2;
  SQRESULT SVar3;
  char *err;
  SQInteger eidx;
  SQInteger sidx;
  SQObjectPtr o;
  long local_38;
  long local_30;
  SQObjectPtr local_28;
  SQObjectPtr local_18;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  get_slice_params(v,&local_30,&local_38,&local_28);
  pSVar2 = ((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
           _sharedstate;
  if (local_30 < 0) {
    local_30 = (long)&pSVar2->_metamethods + local_30;
  }
  if (local_38 < 0) {
    local_38 = (long)&pSVar2->_metamethods + local_38;
  }
  if (local_38 < local_30) {
    err = "wrong indexes";
  }
  else {
    if (local_38 <= (long)pSVar2 && -1 < local_30) {
      local_18.super_SQObject._unVal.pString =
           SQString::Create(v->_sharedstate,
                            (SQChar *)
                            ((long)&(local_28.super_SQObject._unVal.pTable)->_firstfree + local_30),
                            local_38 - local_30);
      local_18.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(v,&local_18);
      SQObjectPtr::~SQObjectPtr(&local_18);
      SVar3 = 1;
      goto LAB_0012944e;
    }
    err = "slice out of range";
  }
  SVar3 = sq_throwerror(v,err);
LAB_0012944e:
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar3;
}

Assistant:

static SQInteger string_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(SQ_FAILED(get_slice_params(v,sidx,eidx,o)))return -1;
    SQInteger slen = _string(o)->_len;
    if(sidx < 0)sidx = slen + sidx;
    if(eidx < 0)eidx = slen + eidx;
    if(eidx < sidx) return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > slen || sidx < 0) return sq_throwerror(v, _SC("slice out of range"));
    v->Push(SQString::Create(_ss(v),&_stringval(o)[sidx],eidx-sidx));
    return 1;
}